

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_noActualCallForUnmodifiedOutputParameter_Test::
TEST_MockParameterTest_noActualCallForUnmodifiedOutputParameter_Test
          (TEST_MockParameterTest_noActualCallForUnmodifiedOutputParameter_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockParameterTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockParameterTest::TEST_GROUP_CppUTestGroupMockParameterTest
            (&this->super_TEST_GROUP_CppUTestGroupMockParameterTest);
  (this->super_TEST_GROUP_CppUTestGroupMockParameterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002e3758;
  return;
}

Assistant:

TEST(MockParameterTest, noActualCallForUnmodifiedOutputParameter)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    mock().expectOneCall("foo").withUnmodifiedOutputParameter("output");

    expectations.addFunction("foo")->withUnmodifiedOutputParameter("output");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}